

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O2

void __thiscall
PlayingState::CmdSetCourse
          (PlayingState *this,string *input,shared_ptr<Connection> *connection,
          shared_ptr<GameData> *game_data)

{
  element_type *name;
  element_type *peVar1;
  bool bVar2;
  ostream *poVar3;
  undefined1 InSpace;
  element_type *peVar4;
  double dVar5;
  shared_ptr<GameData> game_data_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  shared_ptr<Ship> ship;
  double local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  shared_ptr<Planet> planet;
  shared_ptr<Player> player;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_3a8;
  __shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2> local_398;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_388;
  _Vector_base<int,_std::allocator<int>_> local_378;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260 [32];
  string local_240;
  string local_220;
  string data;
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Connection>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Connection>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
  local_1e0;
  stringstream ss;
  double local_1a8;
  double local_1a0 [47];
  
  InSpace = SUB81(game_data,0);
  std::__cxx11::string::string((string *)&data,(string *)this);
  std::__cxx11::string::string((string *)&local_220,(string *)&data);
  Tokenizer::GetAllTokens(&params,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  Connection::GetPlayer((Connection *)&player);
  Entity::GetShip((Entity *)&ship);
  std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_388,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)input);
  peVar4 = (element_type *)connection;
  std::__shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_398,(__shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2> *)connection);
  game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  bVar2 = CheckCockpitCommand((shared_ptr<Connection> *)&local_388,game_data_00,(bool)InSpace);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_398._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_388._M_refcount);
  if (!bVar2) goto LAB_0015aa3c;
  if (params.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      params.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string
              ((string *)&local_240,
               (string *)
               params.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar2 = Utils::IsNumber(&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    if (bVar2) goto LAB_0015a5a3;
    name = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string
              (local_260,
               (string *)
               params.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    GameData::GetPlanet((GameData *)&planet,(string *)name);
    std::__cxx11::string::~string(local_260);
    if (planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
    {
      std::__cxx11::string::string
                ((string *)&local_280,"That planet does not exist in this system\n",(allocator *)&ss
                );
      std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3a8,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)input);
      Sender::Send(&local_280,(shared_ptr<Connection> *)&local_3a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a8._M_refcount);
      std::__cxx11::string::~string((string *)&local_280);
      local_3e8._8_8_ = 0.0;
      local_3e8._M_allocated_capacity = 0;
      local_3f0 = 0.0;
    }
    else {
      Planet::GetCoordinates(planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_3e8._8_8_ = _ss;
      local_3e8._M_allocated_capacity = (size_type)local_1a8;
      local_3f0 = local_1a0[0];
      if (0x20 < (ulong)((long)params.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)params.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        std::__cxx11::string::string
                  ((string *)&local_2a0,
                   (string *)
                   (params.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        bVar2 = Utils::IsNumber(&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        peVar1 = ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (bVar2) {
          dVar5 = std::__cxx11::stod(params.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
          Ship::SetSpeed(peVar1,dVar5);
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
    goto LAB_0015aa3c;
LAB_0015a85e:
    Ship::SetDestination
              (ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (double)local_3e8._8_8_,(double)local_3e8._M_allocated_capacity,local_3f0);
    Ship::SetInOrbit(ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false);
    dVar5 = Ship::GetSpeed(ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ChangeSpeed(dVar5,&ship);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<((ostream *)local_1a0,"Course set for ");
    std::operator<<(poVar3,"X: ");
    poVar3 = std::ostream::_M_insert<double>((double)local_3e8._8_8_);
    std::operator<<(poVar3," Y: ");
    poVar3 = std::ostream::_M_insert<double>((double)local_3e8._M_allocated_capacity);
    std::operator<<(poVar3," Z: ");
    poVar3 = std::ostream::_M_insert<double>(local_3f0);
    std::operator<<(poVar3," at speed ");
    dVar5 = Ship::GetSpeed(ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringbuf::str();
    GameData::GetLoggedInConnections
              ((map<int,_std::shared_ptr<Connection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
                *)&local_1e0,
               (GameData *)
               (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    Ship::GetPlayerIDs((vector<int,_std::allocator<int>_> *)&local_378,
                       ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Sender::SendToMultiple
              (&local_320,
               (map<int,_std::shared_ptr<Connection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
                *)&local_1e0,(vector<int,_std::allocator<int>_> *)&local_378);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_378);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Connection>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Connection>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
    ::~_Rb_tree(&local_1e0);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    goto LAB_0015aa3c;
  }
LAB_0015a5a3:
  if (0x40 < (ulong)((long)params.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)params.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::string
              ((string *)&local_340,
               (string *)
               params.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar2 = Utils::IsNumber(&local_340);
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&local_360,
                 (string *)
                 (params.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      bVar2 = Utils::IsNumber(&local_360);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&local_2c0,
                   (string *)
                   (params.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2));
        bVar2 = Utils::IsNumber(&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_340);
        if (bVar2) {
          local_3e8._8_8_ =
               std::__cxx11::stod(params.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0);
          local_3e8._M_allocated_capacity =
               (size_type)
               std::__cxx11::stod(params.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
          local_3f0 = std::__cxx11::stod(params.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0
                                        );
          if (0x60 < (ulong)((long)params.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)params.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            std::__cxx11::string::string
                      ((string *)&local_2e0,
                       (string *)
                       (params.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 3));
            bVar2 = Utils::IsNumber(&local_2e0);
            std::__cxx11::string::~string((string *)&local_2e0);
            peVar1 = ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (bVar2) {
              dVar5 = std::__cxx11::stod(params.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0
                                        );
              Ship::SetSpeed(peVar1,dVar5);
            }
          }
          goto LAB_0015a85e;
        }
        goto LAB_0015a9e9;
      }
      std::__cxx11::string::~string((string *)&local_360);
    }
    std::__cxx11::string::~string((string *)&local_340);
  }
LAB_0015a9e9:
  std::__cxx11::string::string
            ((string *)&local_300,"Course not set, bad parameters\n",(allocator *)&ss);
  std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3b8,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)input);
  Sender::Send(&local_300,(shared_ptr<Connection> *)&local_3b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount);
  std::__cxx11::string::~string((string *)&local_300);
LAB_0015aa3c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ship.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&params);
  std::__cxx11::string::~string((string *)&data);
  return;
}

Assistant:

void PlayingState::CmdSetCourse(const std::string &input, std::shared_ptr<Connection> connection,
                                std::shared_ptr<GameData> game_data) {
    std::string data = input;
    auto params = Tokenizer::GetAllTokens(data);
    double x = 0;
    double y = 0;
    double z = 0;
    auto player = connection->GetPlayer();
    bool course_set = false;
    auto ship = player->GetShip();
    if (CheckCockpitCommand(connection, game_data, true)) {
        // TODO: Skill check

        if (params.size() > 0 and !Utils::IsNumber(params[0])) {
            auto planet = game_data->GetPlanet(params[0]);
            if (planet == nullptr) {
                Sender::Send("That planet does not exist in this system\n", connection);
                return;
            }
            else {
                Utils::Vector3 coords = planet->GetCoordinates();
                x = coords.x;
                y = coords.y;
                z = coords.z;
                if (params.size() > 1 and Utils::IsNumber(params[1])) {
                    ship->SetSpeed(std::stod(params[1]));
                }
                course_set = true;
            }
        }
        else if (params.size() >= 3 and Utils::IsNumber(params[0])
                 and Utils::IsNumber(params[1]) and Utils::IsNumber(params[2])) {
            x = std::stod(params[0]);
            y = std::stod(params[1]);
            z = std::stod(params[2]);
            if (params.size() >= 4 and Utils::IsNumber(params[3])) {
                ship->SetSpeed(std::stod(params[3]));
            }
            course_set = true;
        }
        if (!course_set) {
            Sender::Send("Course not set, bad parameters\n", connection);
            return;
        }
        ship->SetDestination(x, y, z);
        ship->SetInOrbit(false);
        ChangeSpeed(ship->GetSpeed(), ship);
        std::stringstream ss;
        ss << "Course set for " << "X: " << x << " Y: " << y
        << " Z: " << z << " at speed " << ship->GetSpeed() << "\n";
        Sender::SendToMultiple(ss.str(), game_data->GetLoggedInConnections(),
                               ship->GetPlayerIDs());
    }
}